

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdecode.c
# Opt level: O3

FT_Error cff_decoder_prepare(CFF_Decoder *decoder,CFF_Size size,FT_UInt glyph_index)

{
  uint uVar1;
  void *pvVar2;
  byte bVar3;
  FT_Int FVar4;
  FT_Size ftsize;
  CFF_SubFont pCVar5;
  
  pvVar2 = (((decoder->builder).face)->extra).data;
  if (*(int *)((long)pvVar2 + 0xb30) == 0) {
    pCVar5 = (CFF_SubFont)((long)pvVar2 + 0x668);
  }
  else {
    bVar3 = (**(code **)(*(long *)((long)pvVar2 + 0x1368) + 0x10))
                      ((long)pvVar2 + 0x1338,glyph_index);
    if (*(uint *)((long)pvVar2 + 0xb30) <= (uint)bVar3) {
      return 3;
    }
    pCVar5 = *(CFF_SubFont *)((long)pvVar2 + (ulong)bVar3 * 8 + 0xb38);
    if ((size != (CFF_Size)0x0) && ((decoder->builder).hints_funcs != (void *)0x0)) {
      (decoder->builder).hints_globals =
           *(void **)((long)((size->root).internal)->module_data + (ulong)bVar3 * 8 + 8);
    }
  }
  uVar1 = (pCVar5->local_subrs_index).count;
  decoder->num_locals = uVar1;
  decoder->locals = pCVar5->local_subrs;
  FVar4 = 0;
  if (((decoder->cff->top_font).font_dict.charstring_type != 1) && (FVar4 = 0x6b, 0x4d7 < uVar1)) {
    FVar4 = 0x8000;
    if (uVar1 < 0x846c) {
      FVar4 = 0x46b;
    }
  }
  decoder->locals_bias = FVar4;
  decoder->glyph_width = (pCVar5->private_dict).default_width;
  decoder->nominal_width = (pCVar5->private_dict).nominal_width;
  decoder->current_subfont = pCVar5;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_decoder_prepare( CFF_Decoder*  decoder,
                       CFF_Size      size,
                       FT_UInt       glyph_index )
  {
    CFF_Builder  *builder = &decoder->builder;
    CFF_Font      cff     = (CFF_Font)builder->face->extra.data;
    CFF_SubFont   sub     = &cff->top_font;
    FT_Error      error   = FT_Err_Ok;

    FT_Service_CFFLoad  cffload = (FT_Service_CFFLoad)cff->cffload;


    /* manage CID fonts */
    if ( cff->num_subfonts )
    {
      FT_Byte  fd_index = cffload->fd_select_get( &cff->fd_select,
                                                  glyph_index );


      if ( fd_index >= cff->num_subfonts )
      {
        FT_TRACE4(( "cff_decoder_prepare: invalid CID subfont index\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      FT_TRACE3(( "  in subfont %d:\n", fd_index ));

      sub = cff->subfonts[fd_index];

      if ( builder->hints_funcs && size )
      {
        FT_Size       ftsize   = FT_SIZE( size );
        CFF_Internal  internal = (CFF_Internal)ftsize->internal->module_data;


        /* for CFFs without subfonts, this value has already been set */
        builder->hints_globals = (void *)internal->subfonts[fd_index];
      }
    }

    decoder->num_locals  = sub->local_subrs_index.count;
    decoder->locals      = sub->local_subrs;
    decoder->locals_bias = cff_compute_bias(
                             decoder->cff->top_font.font_dict.charstring_type,
                             decoder->num_locals );

    decoder->glyph_width   = sub->private_dict.default_width;
    decoder->nominal_width = sub->private_dict.nominal_width;

    decoder->current_subfont = sub;

  Exit:
    return error;
  }